

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O3

Value * __thiscall toml::Value::ensureValue(Value *this,string *key)

{
  undefined4 uVar1;
  Type TVar2;
  iterator iVar3;
  string *psVar4;
  _Base_ptr unaff_R13;
  Token t;
  string part;
  Lexer lexer;
  istringstream ss;
  undefined1 local_278 [8];
  anon_union_8_8_51f126cb_for_Value_2 local_270;
  size_type local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  size_t local_250;
  double dStack_248;
  time_point local_240;
  undefined1 local_238 [8];
  anon_union_8_8_51f126cb_for_Value_2 aStack_230;
  _Base_ptr local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  size_t local_210;
  double dStack_208;
  time_point local_200;
  key_type local_1f8;
  Value local_1d8;
  Lexer local_1c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
  local_1b8 [2];
  ios_base local_140 [272];
  
  TVar2 = this->type_;
  if (TVar2 == NULL_TYPE) {
    local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1b8[0]._M_impl.super__Rb_tree_header._M_header;
    local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1b8[0]._M_impl._0_8_ = 0;
    local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1b8[0]._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_1b8[0]._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_278._0_4_ = TABLE_TYPE;
    local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_left;
    local_270.null_ = operator_new(0x30);
    *(_Base_ptr *)(local_270.int_ + 0x10) = (_Base_ptr)0x0;
    *(_Rb_tree_header **)((long)&(local_270.string_)->field_2 + 8) =
         (_Rb_tree_header *)&(local_270.string_)->_M_string_length;
    *(_Rb_tree_header **)(local_270.int_ + 0x20) =
         (_Rb_tree_header *)&(local_270.string_)->_M_string_length;
    ((local_270.table_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    (((_Rb_tree_header *)&(local_270.string_)->_M_string_length)->_M_header)._M_color = _S_red;
    if ((Value *)local_278 != this) {
      ~Value(this);
      this->type_ = local_278._0_4_;
      switch(local_278._0_4_) {
      case 0:
      case 2:
      case 4:
      case 5:
      case 6:
      case 7:
        (this->field_1).table_ = (Table *)local_270;
        break;
      case 1:
        (this->field_1).bool_ = local_270.bool_;
        break;
      case 3:
        (this->field_1).table_ = (Table *)local_270;
        break;
      default:
        this->type_ = NULL_TYPE;
        (this->field_1).null_ = (void *)0x0;
      }
      local_278._0_4_ = NULL_TYPE;
      local_270.null_ = (Table *)0x0;
    }
    ~Value((Value *)local_278);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
    ::~_Rb_tree(local_1b8);
    TVar2 = this->type_;
  }
  if (TVar2 != TABLE_TYPE) {
    failwith<char_const(&)[28]>((char (*) [28])"encountered non table value");
  }
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b8,(string *)key,_S_in);
  local_1c8.lineNo_ = 1;
  local_1c8.is_ = (istream *)local_1b8;
  do {
    psVar4 = (string *)(local_238 + 8);
    internal::Lexer::nextToken((Token *)local_278,&local_1c8,false);
    if (1 < local_278._0_4_ - DOUBLE_TYPE) {
      failwith<char_const(&)[12]>((char (*) [12])"invalid key");
    }
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,local_270.null_,(undefined1 *)(local_270.int_ + local_268));
    internal::Lexer::nextToken((Token *)local_238,&local_1c8,false);
    local_278._0_4_ = local_238._0_4_;
    std::__cxx11::string::operator=((string *)(local_278 + 8),psVar4);
    local_240.__d.__r = local_200.__d.__r;
    local_250 = local_210;
    dStack_248 = dStack_208;
    if (aStack_230 != local_238 + 0x18) {
      operator_delete(aStack_230.null_,(ulong)(local_220._M_allocated_capacity + 1));
    }
    uVar1 = local_278._0_4_;
    if (local_278._0_4_ == 0xb) {
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                      *)((_Base_ptr)this)->_M_parent,&local_1f8);
      if (iVar3._M_node == (_Base_ptr)&((_Base_ptr)this)->_M_parent->_M_parent) {
        local_228 = (_Base_ptr)0x0;
        local_238 = (undefined1  [8])0x0;
        aStack_230.null_ = (pointer)0x0;
        local_210 = 0;
        local_1d8.type_ = TABLE_TYPE;
        local_220._M_allocated_capacity = (size_type)psVar4;
        local_220._8_8_ = psVar4;
        local_1d8.field_1.null_ = operator_new(0x30);
        ((local_1d8.field_1.array_)->super__Vector_base<toml::Value,_std::allocator<toml::Value>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        *(size_type **)((long)&(local_1d8.field_1.string_)->field_2 + 8) =
             &(local_1d8.field_1.string_)->_M_string_length;
        ((local_1d8.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)&(local_1d8.field_1.string_)->_M_string_length;
        ((local_1d8.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
        *(undefined4 *)&(local_1d8.field_1.string_)->_M_string_length = 0;
        this = setChild(this,&local_1f8,&local_1d8);
        ~Value(&local_1d8);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                     *)local_238);
      }
      else {
        if (iVar3._M_node[2]._M_color != 7) {
          failwith<char_const(&)[28]>((char (*) [28])"encountered non table value");
        }
        this = (Value *)(iVar3._M_node + 2);
      }
    }
    else {
      if (local_278._0_4_ != BOOL_TYPE) {
        failwith<char_const(&)[12]>((char (*) [12])"invalid key");
      }
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                      *)((_Base_ptr)this)->_M_parent,&local_1f8);
      if (iVar3._M_node == (_Base_ptr)&((_Base_ptr)this)->_M_parent->_M_parent) {
        local_238 = (undefined1  [8])((ulong)local_238 & 0xffffffff00000000);
        aStack_230.null_ = (pointer)0x0;
        unaff_R13 = (_Base_ptr)setChild(this,&local_1f8,(Value *)local_238);
        ~Value((Value *)local_238);
      }
      else {
        unaff_R13 = iVar3._M_node + 2;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if (local_270 != (Table *)(local_278 + 0x18)) {
      operator_delete(local_270.null_,local_260._M_allocated_capacity + 1);
    }
  } while (uVar1 == 0xb);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b8);
  std::ios_base::~ios_base(local_140);
  return (Value *)unaff_R13;
}

Assistant:

inline Value* Value::ensureValue(const std::string& key)
{
    if (!valid())
        *this = Value((Table()));
    if (!is<Table>()) {
        failwith("encountered non table value");
    }

    std::istringstream ss(key);
    internal::Lexer lexer(ss);

    Value* current = this;
    while (true) {
        internal::Token t = lexer.nextKeyToken();
        if (!(t.type() == internal::TokenType::IDENT || t.type() == internal::TokenType::STRING)) {
            failwith("invalid key");
        }

        std::string part = t.strValue();
        t = lexer.nextKeyToken();
        if (t.type() == internal::TokenType::DOT) {
            if (Value* candidate = current->findChild(part)) {
                if (!candidate->is<Table>())
                    failwith("encountered non table value");

                current = candidate;
            } else {
                current = current->setChild(part, Table());
            }
        } else if (t.type() == internal::TokenType::END_OF_FILE) {
            if (Value* v = current->findChild(part))
                return v;
            return current->setChild(part, Value());
        } else {
            failwith("invalid key");
        }
    }
}